

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManTransformMiter2(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int nPart;
  int iLit;
  int i;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  uVar2 = Gia_ManPoNum(p);
  if ((uVar2 & 1) == 0) {
    iVar3 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar3);
    pcVar5 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar5;
    pGVar6 = Gia_ManConst0(p);
    pGVar6->Value = 0;
    Gia_ManHashAlloc(p_00);
    nPart = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (nPart < iVar3) {
        pObj2 = Gia_ManCi(p,nPart);
        bVar8 = pObj2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pObj2->Value = uVar2;
      nPart = nPart + 1;
    }
    nPart = 0;
    while( true ) {
      bVar8 = false;
      if (nPart < p->nObjs) {
        pObj2 = Gia_ManObj(p,nPart);
        bVar8 = pObj2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(pObj2);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjFanin0Copy(pObj2);
        iVar4 = Gia_ObjFanin1Copy(pObj2);
        uVar2 = Gia_ManHashAnd(p_00,iVar3,iVar4);
        pObj2->Value = uVar2;
      }
      nPart = nPart + 1;
    }
    nPart = 0;
    while( true ) {
      iVar3 = Gia_ManPoNum(p);
      bVar8 = false;
      if (nPart < iVar3) {
        pObj2 = Gia_ManCo(p,nPart);
        bVar8 = pObj2 != (Gia_Obj_t *)0x0;
      }
      if ((!bVar8) || (nPart == iVar1 / 2)) break;
      pGVar6 = Gia_ManPo(p,iVar1 / 2 + nPart);
      iVar3 = Gia_ObjFanin0Copy(pObj2);
      iVar4 = Gia_ObjFanin0Copy(pGVar6);
      iVar3 = Gia_ManHashXor(p_00,iVar3,iVar4);
      Gia_ManAppendCo(p_00,iVar3);
      nPart = nPart + 1;
    }
    nPart = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar8 = false;
      if (nPart < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pObj2 = Gia_ManCo(p,iVar1 + nPart);
        bVar8 = pObj2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjFanin0Copy(pObj2);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      pObj2->Value = uVar2;
      nPart = nPart + 1;
    }
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    pGVar7 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar7;
  }
  __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0xb96,"Gia_Man_t *Gia_ManTransformMiter2(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManTransformMiter2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, iLit, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(pObj2) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}